

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie trie_suffixes(trie t,trie_key key)

{
  trie_node n;
  trie t_00;
  trie_node_suffixes_iterator_args_type suffix_args;
  
  if ((key != (trie_key)0x0 && t != (trie)0x0) && (n = trie_node_find(t,key), n != (trie_node)0x0))
  {
    t_00 = trie_create(t->hash_cb,t->compare_cb);
    if (t_00 == (trie)0x0) {
      log_write_impl_va("metacall",0x306,"trie_suffixes",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,3,"Trie invalid suffix trie creation");
      return (trie)0x0;
    }
    suffix_args.suffix_trie = t_00;
    suffix_args.prefixes = vector_create(8);
    if (suffix_args.prefixes != (vector)0x0) {
      trie_node_iterate(t,n,trie_node_suffixes_cb_iterator,&suffix_args);
      vector_destroy(suffix_args.prefixes);
      return t_00;
    }
    log_write_impl_va("metacall",0x311,"trie_suffixes",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                      ,3,"Trie invalid prefix vector creation");
    trie_destroy(t_00);
  }
  return (trie)0x0;
}

Assistant:

trie trie_suffixes(trie t, trie_key key)
{
	if (t != NULL && key != NULL)
	{
		trie_node node_iterator = trie_node_find(t, key);

		if (node_iterator != NULL)
		{
			trie suffix_trie = trie_create(t->hash_cb, t->compare_cb);

			struct trie_node_suffixes_iterator_args_type suffix_args;

			if (suffix_trie == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid suffix trie creation");

				return NULL;
			}

			suffix_args.suffix_trie = suffix_trie;

			suffix_args.prefixes = vector_create(sizeof(trie_key));

			if (suffix_args.prefixes == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid prefix vector creation");

				trie_destroy(suffix_trie);

				return NULL;
			}

			trie_node_iterate(t, node_iterator, &trie_node_suffixes_cb_iterator, &suffix_args);

			vector_destroy(suffix_args.prefixes);

			return suffix_trie;
		}
	}

	return NULL;
}